

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::tree_type<cs::token_base_*>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<cs::tree_type<cs::token_base*>>,64ul,cs_impl::default_allocator_provider>
::alloc<cs::tree_type<cs::token_base*>&>
          (allocator_type<cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>,_64UL,_cs_impl::default_allocator_provider>
           *this,tree_type<cs::token_base_*> *args)

{
  long lVar1;
  __int_type _Var2;
  holder<cs::tree_type<cs::token_base_*>_> *phVar3;
  new_allocator<cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>_> *in_RSI;
  new_allocator<cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>_> *in_RDI;
  holder<cs::tree_type<cs::token_base_*>_> *ptr;
  holder<cs::tree_type<cs::token_base_*>_> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<cs::tree_type<cs::token_base_*>_> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_002abb52;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>_>::
           allocate(in_RSI,__n,in_RDI);
LAB_002abb52:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::tree_type<cs::token_base*>>>::
  construct<cs_impl::any::holder<cs::tree_type<cs::token_base*>>,cs::tree_type<cs::token_base*>&>
            (in_RDI,in_stack_ffffffffffffffd8,(tree_type<cs::token_base_*> *)0x2abb6d);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}